

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O0

ASTNode * __thiscall
nivalis::anon_unknown_3::Differentiator::copy_ast
          (Differentiator *this,ASTNode *ast,
          vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *out)

{
  reference this_00;
  reference this_01;
  ASTNode *in_RDX;
  Differentiator *in_RSI;
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  *in_RDI;
  ASTNode *n;
  ASTNode *init_pos;
  Differentiator *this_02;
  Differentiator *this_03;
  
  this_03 = in_RSI;
  skip_ast((ASTNode **)in_RSI);
  this_02 = in_RSI;
  for (; in_RSI != this_03; in_RSI = (Differentiator *)&in_RSI->var_addr) {
    if (*(uint32_t *)&in_RSI->nodes == 3) {
      this_00 = std::
                vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                ::back(in_RDI);
      this_01 = std::
                vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                ::operator[](this_00,((anon_union_8_3_343d95dd_for_ASTNode_1 *)&in_RSI->ast_root)->
                                     ref);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator[]
                (this_01,0);
      copy_ast(this_03,in_RDX,
               (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)this_02);
    }
    else {
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::push_back
                ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)this_02,
                 (value_type *)in_RSI);
    }
  }
  return (ASTNode *)this_03;
}

Assistant:

const Expr::ASTNode* copy_ast(const Expr::ASTNode* ast,
            std::vector<Expr::ASTNode>& out) {
        const auto* init_pos = ast;
        skip_ast(&ast);
        for (const auto* n = init_pos; n != ast; ++n) {
            if (n->opcode == OpCode::arg) {
                // Substitute function argument in terms of the input
                copy_ast(&argv.back()[n->ref][0], out);
            } else {
                out.push_back(*n);
            }
        }
        return ast;
    }